

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O2

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::compiler::ModuleLoader::ModuleImpl::embedRelative
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,ModuleImpl *this,
          StringPtr embedPath)

{
  ReadableDirectory *dir;
  Impl *pIVar1;
  StringPtr path;
  Array<kj::String> local_50;
  ArrayPtr<const_kj::String> local_38;
  
  if ((embedPath.content.size_ == 1) || (*embedPath.content.ptr != '/')) {
    dir = this->sourceDir;
    local_38 = (ArrayPtr<const_kj::String>)kj::Path::parent(&this->path);
    pIVar1 = (Impl *)&local_38;
    kj::PathPtr::eval((Path *)&local_50,(PathPtr *)pIVar1,embedPath);
    Impl::readEmbed(__return_storage_ptr__,pIVar1,dir,(PathPtr)local_50._0_16_);
  }
  else {
    pIVar1 = this->loader;
    path.content.size_ = embedPath.content.size_ - 1;
    path.content.ptr = embedPath.content.ptr + 1;
    kj::Path::parse((Path *)&local_50,path);
    Impl::readEmbedFromSearchPath(__return_storage_ptr__,pIVar1,(PathPtr)local_50._0_16_);
  }
  kj::Array<kj::String>::~Array(&local_50);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> embedRelative(kj::StringPtr embedPath) override {
    if (embedPath.size() > 0 && embedPath[0] == '/') {
      return loader.readEmbedFromSearchPath(kj::Path::parse(embedPath.slice(1)));
    } else {
      return loader.readEmbed(sourceDir, path.parent().eval(embedPath));
    }
  }